

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O0

BOOL Js::JavascriptNumber::GetThisValue(Var aValue,double *pDouble)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *this;
  JavascriptTypedNumber<long> *this_00;
  long lVar5;
  JavascriptTypedNumber<unsigned_long> *this_01;
  unsigned_long uVar6;
  JavascriptNumberObject *this_02;
  double dVar7;
  undefined1 auVar8 [16];
  JavascriptNumberObject *obj;
  TypeId typeId;
  double *pDouble_local;
  Var aValue_local;
  TypeId local_18;
  TypeId typeId_1;
  
  if (aValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = TaggedInt::Is(aValue);
  if (bVar2) {
    local_18 = TypeIds_FirstNumberType;
  }
  else {
    bVar2 = Is_NoTaggedIntCheck(aValue);
    if (bVar2) {
      local_18 = TypeIds_Number;
    }
    else {
      this = UnsafeVarTo<Js::RecyclableObject>(aValue);
      if (this == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      local_18 = RecyclableObject::GetTypeId(this);
      if ((0x57 < (int)local_18) && (BVar3 = RecyclableObject::IsExternal(this), BVar3 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
    }
  }
  if ((int)local_18 < 2) {
    aValue_local._4_4_ = 0;
  }
  else if (local_18 == TypeIds_FirstNumberType) {
    dVar7 = TaggedInt::ToDouble(aValue);
    *pDouble = dVar7;
    aValue_local._4_4_ = 1;
  }
  else if (local_18 == TypeIds_Int64Number) {
    this_00 = VarTo<Js::JavascriptTypedNumber<long>>(aValue);
    lVar5 = JavascriptTypedNumber<long>::GetValue(this_00);
    *pDouble = (double)lVar5;
    aValue_local._4_4_ = 1;
  }
  else if (local_18 == TypeIds_LastNumberType) {
    this_01 = VarTo<Js::JavascriptTypedNumber<unsigned_long>>(aValue);
    uVar6 = JavascriptTypedNumber<unsigned_long>::GetValue(this_01);
    auVar8._8_4_ = (int)(uVar6 >> 0x20);
    auVar8._0_8_ = uVar6;
    auVar8._12_4_ = 0x45300000;
    *pDouble = (auVar8._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0);
    aValue_local._4_4_ = 1;
  }
  else {
    bVar2 = Is_NoTaggedIntCheck(aValue);
    if (bVar2) {
      dVar7 = GetValue(aValue);
      *pDouble = dVar7;
      aValue_local._4_4_ = 1;
    }
    else if (local_18 == TypeIds_NumberObject) {
      this_02 = VarTo<Js::JavascriptNumberObject>(aValue);
      dVar7 = JavascriptNumberObject::GetValue(this_02);
      *pDouble = dVar7;
      aValue_local._4_4_ = 1;
    }
    else {
      aValue_local._4_4_ = 0;
    }
  }
  return aValue_local._4_4_;
}

Assistant:

BOOL JavascriptNumber::GetThisValue(Var aValue, double* pDouble)
    {
        TypeId typeId = JavascriptOperators::GetTypeId(aValue);

        if (typeId <= TypeIds_UndefinedOrNull)
        {
            return FALSE;
        }

        if (typeId == TypeIds_Integer)
        {
            *pDouble = TaggedInt::ToDouble(aValue);
            return TRUE;
        }
        else if (typeId == TypeIds_Int64Number)
        {
            *pDouble = (double)VarTo<JavascriptInt64Number>(aValue)->GetValue();
            return TRUE;
        }
        else if (typeId == TypeIds_UInt64Number)
        {
            *pDouble = (double)VarTo<JavascriptUInt64Number>(aValue)->GetValue();
            return TRUE;
        }
        else if (JavascriptNumber::Is_NoTaggedIntCheck(aValue))
        {
            *pDouble = JavascriptNumber::GetValue(aValue);
            return TRUE;
        }
        else if (typeId == TypeIds_NumberObject)
        {
            JavascriptNumberObject* obj = VarTo<JavascriptNumberObject>(aValue);
            *pDouble = obj->GetValue();
            return TRUE;
        }
        else
        {
            return FALSE;
        }
    }